

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistoryTree.cpp
# Opt level: O2

void __thiscall
JointActionObservationHistoryTree::SetSuccessor
          (JointActionObservationHistoryTree *this,Index aI,Index oI,
          JointActionObservationHistoryTree *suc)

{
  bool bVar1;
  JointActionObservationHistoryTree *this_00;
  E *this_01;
  ulong sucI;
  
  if (this->_m_nodeType != O_SUC) {
    sucI = (ulong)aI;
    bVar1 = TreeNode<JointActionObservationHistory>::ExistsSuccessor
                      (&this->super_TreeNode<JointActionObservationHistory>,sucI);
    if (bVar1) {
      this_00 = (JointActionObservationHistoryTree *)
                TreeNode<JointActionObservationHistory>::GetSuccessor
                          (&this->super_TreeNode<JointActionObservationHistory>,sucI);
    }
    else {
      this_00 = (JointActionObservationHistoryTree *)operator_new(0x60);
      JointActionObservationHistoryTree(this_00,O_SUC);
      TreeNode<JointActionObservationHistory>::SetSuccessor
                (&this->super_TreeNode<JointActionObservationHistory>,sucI,
                 (TreeNode<JointActionObservationHistory> *)this_00);
    }
    TreeNode<JointActionObservationHistory>::SetSuccessor
              (&this_00->super_TreeNode<JointActionObservationHistory>,(ulong)oI,
               &suc->super_TreeNode<JointActionObservationHistory>);
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,
       "Trying JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, JointActionObservationHistoryTree* suc)  on O_SUC node"
      );
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI,
        JointActionObservationHistoryTree* suc)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, JointActionObservationHistoryTree* suc)  on O_SUC node");

    //first see if necessary to create a new  intermediate node
    JointActionObservationHistoryTree* oNode; 
    if (this->TreeNode<JointActionObservationHistory>::ExistsSuccessor(aI))
        oNode = (JointActionObservationHistoryTree*)
            this->TreeNode<JointActionObservationHistory>::GetSuccessor(aI);
    else //we need to create an intermediate node
    {
        oNode = new JointActionObservationHistoryTree(O_SUC);
        //which is the aI'th successor of this node
        this->TreeNode<JointActionObservationHistory>::SetSuccessor(aI, oNode);
    }

    //let oNode point to the actual successor.
    //Note: SetSuccessor with 1 index should give no problem for O_SUC nodes
    oNode->TreeNode<JointActionObservationHistory>::SetSuccessor(oI, suc);
}